

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

BOOL __thiscall
Js::CustomExternalWrapperObject::DeleteProperty
          (CustomExternalWrapperObject *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  code *pcVar1;
  anon_class_48_6_c6a7eacb implicitCall;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this_00;
  HostScriptContext *this_01;
  JsGetterSetterInterceptor *pJVar5;
  void **ppvVar6;
  undefined4 *puVar7;
  Var pvVar8;
  undefined1 local_d0 [8];
  PropertyDescriptor targetPropertyDescriptor;
  BOOL trapResult;
  Var deletePropertyResult;
  Var propertyName;
  Var propertyNameNumericValue;
  Var isPropertyNameNumeric;
  JavascriptFunction *deleteMethod;
  CustomExternalWrapperType *type;
  RecyclableObject *targetObj;
  ScriptContext *requestContext;
  ThreadContext *threadContext;
  PropertyOperationFlags flags_local;
  PropertyId propertyId_local;
  CustomExternalWrapperObject *this_local;
  
  threadContext._0_4_ = flags;
  threadContext._4_4_ = propertyId;
  _flags_local = this;
  BVar3 = VerifyObjectAlive(this);
  if (BVar3 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_00 = ScriptContext::GetThreadContext(pSVar4);
    pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    ThreadContext::ProbeStack(this_00,0xc00,pSVar4,(PVOID)0x0);
    pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    requestContext = (ScriptContext *)ScriptContext::GetThreadContext(pSVar4);
    this_01 = ThreadContext::GetPreviousHostScriptContext((ThreadContext *)requestContext);
    targetObj = (RecyclableObject *)HostScriptContext::GetScriptContext(this_01);
    BVar3 = EnsureInitialized(this,(ScriptContext *)targetObj);
    if (BVar3 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      type = (CustomExternalWrapperType *)this;
      deleteMethod = (JavascriptFunction *)GetExternalType(this);
      isPropertyNameNumeric = (Var)0x0;
      pJVar5 = CustomExternalWrapperType::GetJsGetterSetterInterceptor
                         ((CustomExternalWrapperType *)deleteMethod);
      ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&pJVar5->deletePropertyTrap);
      if (*ppvVar6 != (void *)0x0) {
        pJVar5 = CustomExternalWrapperType::GetJsGetterSetterInterceptor
                           ((CustomExternalWrapperType *)deleteMethod);
        ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)&pJVar5->deletePropertyTrap);
        isPropertyNameNumeric = VarTo<Js::JavascriptFunction>(*ppvVar6);
      }
      pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      bVar2 = ScriptContext::IsHeapEnumInProgress(pSVar4);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                    ,0x435,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                    "!GetScriptContext()->IsHeapEnumInProgress()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (isPropertyNameNumeric == (Var)0x0) {
        this_local._4_4_ =
             DynamicObject::DeleteProperty
                       (&this->super_DynamicObject,threadContext._4_4_,
                        (PropertyOperationFlags)threadContext);
      }
      else {
        pvVar8 = GetName(this,(ScriptContext *)targetObj,threadContext._4_4_,
                         &propertyNameNumericValue,&propertyName);
        implicitCall.deleteMethod = (JavascriptFunction *)isPropertyNameNumeric;
        implicitCall.threadContext = (ThreadContext *)requestContext;
        implicitCall.targetObj = (RecyclableObject *)type;
        implicitCall.propertyName = pvVar8;
        implicitCall.isPropertyNameNumeric = propertyNameNumericValue;
        implicitCall.propertyNameNumericValue = propertyName;
        pvVar8 = ThreadContext::
                 ExecuteImplicitCall<Js::CustomExternalWrapperObject::DeleteProperty(int,Js::PropertyOperationFlags)::__0>
                           ((ThreadContext *)requestContext,
                            (RecyclableObject *)isPropertyNameNumeric,ImplicitCall_Accessor,
                            implicitCall);
        targetPropertyDescriptor._44_4_ =
             JavascriptConversion::ToBoolean(pvVar8,(ScriptContext *)targetObj);
        if (targetPropertyDescriptor._44_4_ == 0) {
          if (((PropertyOperationFlags)threadContext & PropertyOperation_StrictMode) !=
              PropertyOperation_None) {
            JavascriptError::ThrowTypeError
                      ((ScriptContext *)targetObj,-0x7ff5ea14,L"deleteProperty");
          }
          this_local._4_4_ = 0;
        }
        else {
          PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_d0);
          BVar3 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                            ((RecyclableObject *)type,threadContext._4_4_,(ScriptContext *)targetObj
                             ,(PropertyDescriptor *)local_d0);
          if (BVar3 == 0) {
            this_local._4_4_ = 1;
          }
          else {
            bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_d0);
            if (!bVar2) {
              JavascriptError::ThrowTypeError
                        ((ScriptContext *)targetObj,-0x7ff5ea14,L"deleteProperty");
            }
            this_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL CustomExternalWrapperObject::DeleteProperty(Js::PropertyId propertyId, Js::PropertyOperationFlags flags)
{
    if (!this->VerifyObjectAlive()) return FALSE;

    PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

    ThreadContext* threadContext = GetScriptContext()->GetThreadContext();

    // Caller does not pass requestContext. Retrieve from host scriptContext stack.
    Js::ScriptContext* requestContext =
        threadContext->GetPreviousHostScriptContext()->GetScriptContext();

    if (!this->EnsureInitialized(requestContext))
    {
        return FALSE;
    }

    RecyclableObject * targetObj = this;
    CustomExternalWrapperType * type = this->GetExternalType();
    Js::JavascriptFunction* deleteMethod = nullptr;
    if (type->GetJsGetterSetterInterceptor()->deletePropertyTrap != nullptr)
    {
        deleteMethod = Js::VarTo<JavascriptFunction>(type->GetJsGetterSetterInterceptor()->deletePropertyTrap);
    }

    Assert(!GetScriptContext()->IsHeapEnumInProgress());
    if (nullptr == deleteMethod)
    {
        return __super::DeleteProperty(propertyId, flags);
    }

    Js::Var isPropertyNameNumeric;
    Js::Var propertyNameNumericValue;
    Js::Var propertyName = GetName(requestContext, propertyId, &isPropertyNameNumeric, &propertyNameNumericValue);

    Js::Var deletePropertyResult = threadContext->ExecuteImplicitCall(deleteMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, deleteMethod, Js::CallInfo(Js::CallFlags_Value, 4), targetObj, propertyName, isPropertyNameNumeric, propertyNameNumericValue);
    });

    BOOL trapResult = Js::JavascriptConversion::ToBoolean(deletePropertyResult, requestContext);
    if (!trapResult)
    {
        if (flags & Js::PropertyOperation_StrictMode)
        {
            Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("deleteProperty"));
        }
        return trapResult;
    }

    Js::PropertyDescriptor targetPropertyDescriptor;
    if (!Js::JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetPropertyDescriptor))
    {
        return TRUE;
    }
    if (!targetPropertyDescriptor.IsConfigurable())
    {
        Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("deleteProperty"));
    }
    return TRUE;
}